

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.h
# Opt level: O1

CTInfo lj_ctype_info(CTState *cts,CTypeID id,CTSize *szp)

{
  uint uVar1;
  CType *pCVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  CType *pCVar6;
  uint uVar7;
  CTSize CVar8;
  
  pCVar2 = cts->tab;
  pCVar6 = pCVar2 + id;
  uVar5 = 0;
  do {
    uVar1 = pCVar6->info;
    uVar7 = uVar1 >> 0x1c;
    if (uVar7 == 5) {
LAB_00149c09:
      pCVar6 = pCVar2 + (uVar1 & 0xffff);
      bVar4 = true;
    }
    else {
      if (uVar7 == 8) {
        if ((uVar1 & 0x80ff0000) == 0x80020000) {
          if ((uVar5 & 1) == 0) {
            uVar5 = pCVar6->size << 0x10 | uVar5 | 1;
          }
        }
        else if ((uVar1 & 0x80ff0000) == 0x80010000) {
          uVar5 = uVar5 | pCVar6->size;
        }
        goto LAB_00149c09;
      }
      uVar3 = uVar1 & 0xf0000;
      if ((uVar5 & 1) != 0) {
        uVar3 = 0;
      }
      CVar8 = 0xffffffff;
      if (uVar7 != 6) {
        CVar8 = pCVar6->size;
      }
      uVar5 = uVar1 & 0xfff00000 | uVar3 | uVar5;
      *szp = CVar8;
      bVar4 = false;
    }
    if (!bVar4) {
      return uVar5;
    }
  } while( true );
}

Assistant:

static LJ_AINLINE CType *ctype_get(CTState *cts, CTypeID id)
{
  return &cts->tab[ctype_check(cts, id)];
}